

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

QString * Message::getMessages(void)

{
  QString *in_RDI;
  
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (char16_t *)0x0;
  (in_RDI->d).size = 0;
  while (messageQueue.c.super__Deque_base<QString,_std::allocator<QString>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         messageQueue.c.super__Deque_base<QString,_std::allocator<QString>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    QString::append(in_RDI);
    std::deque<QString,_std::allocator<QString>_>::pop_front(&messageQueue.c);
  }
  return in_RDI;
}

Assistant:

QString Message::getMessages()
{
    QString message;
    while ( messageQueue.empty() == false )
    {
        message += messageQueue.front();
        messageQueue.pop();
    }

    return message;
}